

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall pstack::FileReader::~FileReader(FileReader *this)

{
  FileReader *this_local;
  
  ~FileReader(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

FileReader::~FileReader()
{
    ::close(file);
}